

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * ensure(printbuffer *p,int needed)

{
  int iVar1;
  char *__dest;
  int newsize;
  char *newbuffer;
  int needed_local;
  printbuffer *p_local;
  
  if ((p == (printbuffer *)0x0) || (p->buffer == (char *)0x0)) {
    p_local = (printbuffer *)0x0;
  }
  else {
    iVar1 = p->offset + needed;
    if (p->length < iVar1) {
      iVar1 = pow2gt(iVar1);
      __dest = (char *)(*cJSON_malloc)((long)iVar1);
      if (__dest == (char *)0x0) {
        (*cJSON_free)(p->buffer);
        p->length = 0;
        p->buffer = (char *)0x0;
        p_local = (printbuffer *)0x0;
      }
      else {
        if (__dest != (char *)0x0) {
          memcpy(__dest,p->buffer,(long)p->length);
        }
        (*cJSON_free)(p->buffer);
        p->length = iVar1;
        p->buffer = __dest;
        p_local = (printbuffer *)(__dest + p->offset);
      }
    }
    else {
      p_local = (printbuffer *)(p->buffer + p->offset);
    }
  }
  return (char *)p_local;
}

Assistant:

static char* ensure(printbuffer *p,int needed)
{
	char *newbuffer;int newsize;
	if (!p || !p->buffer) return 0;
	needed+=p->offset;
	if (needed<=p->length) return p->buffer+p->offset;

	newsize=pow2gt(needed);
	newbuffer=(char*)cJSON_malloc(newsize);
	if (!newbuffer) {cJSON_free(p->buffer);p->length=0,p->buffer=0;return 0;}
	if (newbuffer) memcpy(newbuffer,p->buffer,p->length);
	cJSON_free(p->buffer);
	p->length=newsize;
	p->buffer=newbuffer;
	return newbuffer+p->offset;
}